

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O1

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)

{
  EverCrypt_Hash_state_s *s;
  undefined8 uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  uint32_t extraout_EAX_01;
  uint32_t extraout_EAX_02;
  uint32_t extraout_EAX_03;
  uint32_t extraout_EAX_04;
  uint32_t extraout_EAX_05;
  uint32_t extraout_EAX_06;
  uint32_t extraout_EAX_07;
  uint32_t extraout_EAX_08;
  void *pvVar4;
  Lib_IntVector_Intrinsics_vec256 *palVar5;
  EVP_PKEY_CTX *ctx;
  undefined8 *puVar6;
  EVP_PKEY_CTX EVar7;
  undefined7 in_register_00000039;
  ulong uVar8;
  byte *__nmemb;
  
  uVar8 = CONCAT71(in_register_00000039,a);
  if (a < 0xc) {
    return *(uint32_t *)(&DAT_001e5420 + (ulong)a * 4);
  }
  EverCrypt_Hash_Incremental_hash_len_cold_1();
  block_len((Spec_Hash_Definitions_hash_alg)uVar8);
  uVar3 = block_len((Spec_Hash_Definitions_hash_alg)uVar8);
  __nmemb = (byte *)(ulong)uVar3;
  pvVar4 = calloc((size_t)__nmemb,1);
  switch(uVar8 & 0xffffffff) {
  case 0:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    EVar7 = (EVP_PKEY_CTX)0x2;
    break;
  case 1:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    EVar7 = (EVP_PKEY_CTX)0x3;
    break;
  case 2:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    EVar7 = (EVP_PKEY_CTX)0x4;
    break;
  case 3:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    EVar7 = (EVP_PKEY_CTX)0x5;
    break;
  case 4:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(5,4);
    EVar7 = (EVP_PKEY_CTX)0x1;
    break;
  case 5:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(4,4);
    EVar7 = (EVP_PKEY_CTX)0x0;
    break;
  case 6:
    _Var2 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var2) {
      EVar7 = (EVP_PKEY_CTX)0xb;
      palVar5 = (Lib_IntVector_Intrinsics_vec256 *)Hacl_Hash_Blake2s_Simd128_malloc_with_key();
    }
    else {
      palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,4);
      EVar7 = (EVP_PKEY_CTX)0xa;
    }
    break;
  case 7:
    _Var2 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var2) {
      EVar7 = (EVP_PKEY_CTX)0xd;
      palVar5 = Hacl_Hash_Blake2b_Simd256_malloc_with_key();
    }
    else {
      palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,8);
      EVar7 = (EVP_PKEY_CTX)0xc;
    }
    break;
  case 8:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    EVar7 = (EVP_PKEY_CTX)0x7;
    break;
  case 9:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    EVar7 = (EVP_PKEY_CTX)0x6;
    break;
  case 10:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    EVar7 = (EVP_PKEY_CTX)0x8;
    break;
  case 0xb:
    palVar5 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    EVar7 = (EVP_PKEY_CTX)0x9;
    break;
  default:
    EverCrypt_Hash_Incremental_malloc_cold_1();
    if ((byte)__nmemb < 0xe) {
      return *(uint32_t *)(&DAT_001e5450 + ((ulong)__nmemb & 0xff) * 4);
    }
    block_len_cold_1();
    if (0xd < *__nmemb) {
      init_cold_1();
      s = *(EverCrypt_Hash_state_s **)__nmemb;
      uVar1 = *(undefined8 *)(__nmemb + 8);
      alg_of_state(s);
      uVar3 = init((EVP_PKEY_CTX *)s);
      *(EverCrypt_Hash_state_s **)__nmemb = s;
      *(undefined8 *)(__nmemb + 8) = uVar1;
      __nmemb[0x10] = 0;
      __nmemb[0x11] = 0;
      __nmemb[0x12] = 0;
      __nmemb[0x13] = 0;
      __nmemb[0x14] = 0;
      __nmemb[0x15] = 0;
      __nmemb[0x16] = 0;
      __nmemb[0x17] = 0;
      return uVar3;
    }
    palVar5 = *(Lib_IntVector_Intrinsics_vec256 **)(__nmemb + 8);
    switch(*__nmemb) {
    case 0:
      Hacl_Hash_MD5_init((uint32_t *)palVar5);
      return extraout_EAX_04;
    case 1:
      Hacl_Hash_SHA1_init((uint32_t *)palVar5);
      return extraout_EAX_05;
    case 2:
      Hacl_Hash_SHA2_sha224_init((uint32_t *)palVar5);
      return extraout_EAX_02;
    case 3:
      Hacl_Hash_SHA2_sha256_init((uint32_t *)palVar5);
      return extraout_EAX_03;
    case 4:
      Hacl_Hash_SHA2_sha384_init((uint64_t *)palVar5);
      return extraout_EAX_00;
    case 5:
      Hacl_Hash_SHA2_sha512_init((uint64_t *)palVar5);
      return extraout_EAX_06;
    default:
      pvVar4 = memset(palVar5,0,200);
      return (uint32_t)pvVar4;
    case 10:
      Hacl_Hash_Blake2s_init((uint32_t *)palVar5,0,0x20);
      return extraout_EAX_08;
    case 0xb:
      Hacl_Hash_Blake2s_Simd128_init((Lib_IntVector_Intrinsics_vec128 *)palVar5,0,0x20);
      return extraout_EAX;
    case 0xc:
      Hacl_Hash_Blake2b_init((uint64_t *)palVar5,0,0x40);
      return extraout_EAX_01;
    case 0xd:
      Hacl_Hash_Blake2b_Simd256_init(palVar5,0,0x40);
      return extraout_EAX_07;
    }
  }
  ctx = (EVP_PKEY_CTX *)malloc(0x10);
  *ctx = EVar7;
  *(Lib_IntVector_Intrinsics_vec256 **)(ctx + 8) = palVar5;
  puVar6 = (undefined8 *)malloc(0x18);
  *puVar6 = ctx;
  puVar6[1] = pvVar4;
  puVar6[2] = 0;
  init(ctx);
  return (uint32_t)puVar6;
}

Assistant:

uint32_t EverCrypt_Hash_Incremental_hash_len(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_MD5:
      {
        return MD5_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA1:
      {
        return SHA1_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_224:
      {
        return SHA2_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return SHA2_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return SHA2_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return SHA2_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_224:
      {
        return SHA3_224_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_256:
      {
        return SHA3_256_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_384:
      {
        return SHA3_384_HASH_LEN;
      }
    case Spec_Hash_Definitions_SHA3_512:
      {
        return SHA3_512_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2S:
      {
        return BLAKE2S_HASH_LEN;
      }
    case Spec_Hash_Definitions_Blake2B:
      {
        return BLAKE2B_HASH_LEN;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}